

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::core::ConfidentialTransaction::AddTxIn
          (ConfidentialTransaction *this,Txid *txid,uint32_t index,uint32_t sequence,
          Script *unlocking_script)

{
  uint uVar1;
  size_type sVar2;
  size_type local_528 [15];
  undefined4 local_4b0;
  uint32_t local_49c;
  undefined1 local_495;
  uint32_t local_494;
  CfdException *local_490;
  allocator *local_488;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_480;
  uchar *local_478;
  size_type local_470;
  uint32_t local_468;
  uint32_t local_464;
  uchar *local_460;
  undefined1 *local_458;
  int local_450;
  undefined1 local_449;
  pointer *local_448;
  CfdException *local_440;
  allocator *local_438;
  ConfidentialTransaction *local_430;
  size_type local_428;
  ConfidentialTxIn local_420;
  undefined1 local_2c0 [8];
  ConfidentialTxIn txin;
  long lStack_158;
  uint32_t set_index;
  size_t is_coinbase;
  string local_148;
  CfdSourceLocation local_128;
  int local_110;
  byte local_109;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *script_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> empty_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *txid_buf;
  wally_tx *tx_pointer;
  allocator local_61;
  string local_60;
  CfdSourceLocation local_40;
  Script *local_28;
  Script *unlocking_script_local;
  uint32_t sequence_local;
  uint32_t index_local;
  Txid *txid_local;
  ConfidentialTransaction *this_local;
  
  local_430 = this;
  local_28 = unlocking_script;
  unlocking_script_local._0_4_ = sequence;
  unlocking_script_local._4_4_ = index;
  _sequence_local = txid;
  txid_local = (Txid *)this;
  local_428 = ::std::
              vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
              size(&this->vin_);
  uVar1 = ::std::numeric_limits<unsigned_int>::max();
  if (local_428 == uVar1) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x5ee;
    local_40.funcname = "AddTxIn";
    logger::warn<>(&local_40,"vin maximum.");
    tx_pointer._3_1_ = 1;
    local_440 = (CfdException *)__cxa_allocate_exception(0x30);
    local_438 = &local_61;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_60,"txin maximum.",local_438);
    CfdException::CfdException(local_440,kCfdIllegalStateError,&local_60);
    tx_pointer._3_1_ = 0;
    __cxa_throw(local_440,&CfdException::typeinfo,CfdException::~CfdException);
  }
  txid_buf = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             (local_430->super_AbstractTransaction).wally_tx_pointer_;
  local_448 = &empty_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  Txid::GetData((ByteData *)local_448,_sequence_local);
  ByteData::GetBytes(&local_a0,(ByteData *)local_448);
  ByteData::~ByteData((ByteData *)
                      &empty_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_88 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&script_data);
  local_109 = 0;
  local_449 = Script::IsEmpty(local_28);
  if ((bool)local_449) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&script_data);
  }
  else {
    Script::GetData((ByteData *)&ret,local_28);
    local_109 = 1;
    ByteData::GetBytes(&local_f0,(ByteData *)&ret);
  }
  if ((local_109 & 1) != 0) {
    ByteData::~ByteData((ByteData *)&ret);
  }
  local_d8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0;
  local_480 = txid_buf;
  local_478 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_88);
  local_470 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_88);
  local_468 = unlocking_script_local._4_4_;
  local_464 = (uint32_t)unlocking_script_local;
  local_460 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_d8);
  local_528[0] = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_d8);
  local_4b0 = 0;
  local_528[0xe] = 0;
  local_528[0xd] = 0;
  local_528[0xc] = 0;
  local_528[0xb] = 0;
  local_528[10] = 0;
  local_528[9] = 0;
  local_528[8] = 0;
  local_528[7] = 0;
  local_528[6] = 0;
  local_528[5] = 0;
  local_528[4] = 0;
  local_528[3] = 0;
  local_528[2] = 0;
  local_528[1] = 0;
  local_458 = (undefined1 *)local_528;
  local_450 = wally_tx_add_elements_raw_input
                        (local_480,local_478,local_470,local_468,local_464,local_460);
  local_110 = local_450;
  if (local_450 == 0) {
    lStack_158 = 0;
    wally_tx_is_coinbase(txid_buf,&stack0xfffffffffffffea8);
    if (lStack_158 == 0) {
      local_494 = unlocking_script_local._4_4_ & 0x3fffffff;
    }
    else {
      local_494 = unlocking_script_local._4_4_;
    }
    txin.pegin_witness_.witness_stack_.
    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = local_494;
    ConfidentialTxIn::ConfidentialTxIn
              ((ConfidentialTxIn *)local_2c0,_sequence_local,local_494,
               (uint32_t)unlocking_script_local);
    local_495 = Script::IsEmpty(local_28);
    if (!(bool)local_495) {
      ConfidentialTxIn::ConfidentialTxIn
                (&local_420,_sequence_local,
                 txin.pegin_witness_.witness_stack_.
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                 (uint32_t)unlocking_script_local,local_28);
      ConfidentialTxIn::operator=((ConfidentialTxIn *)local_2c0,&local_420);
      ConfidentialTxIn::~ConfidentialTxIn(&local_420);
    }
    ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
    push_back(&local_430->vin_,(value_type *)local_2c0);
    sVar2 = ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            ::size(&local_430->vin_);
    local_49c = (int)sVar2 - 1;
    ConfidentialTxIn::~ConfidentialTxIn((ConfidentialTxIn *)local_2c0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&script_data);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0);
    return local_49c;
  }
  local_128.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
               ,0x2f);
  local_128.filename = local_128.filename + 1;
  local_128.line = 0x5fe;
  local_128.funcname = "AddTxIn";
  logger::warn<int&>(&local_128,"wally_tx_add_elements_raw_input NG[{}].",&local_110);
  is_coinbase._6_1_ = 1;
  local_490 = (CfdException *)__cxa_allocate_exception(0x30);
  local_488 = (allocator *)((long)&is_coinbase + 7);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_148,"txin add error.",local_488);
  CfdException::CfdException(local_490,kCfdIllegalStateError,&local_148);
  is_coinbase._6_1_ = 0;
  __cxa_throw(local_490,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t ConfidentialTransaction::AddTxIn(
    const Txid &txid, uint32_t index, uint32_t sequence,
    const Script &unlocking_script) {
  if (vin_.size() == std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "vin maximum.");
    throw CfdException(kCfdIllegalStateError, "txin maximum.");
  }

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  const std::vector<uint8_t> &txid_buf = txid.GetData().GetBytes();
  std::vector<uint8_t> empty_data;
  const std::vector<uint8_t> &script_data =
      (unlocking_script.IsEmpty()) ? empty_data
                                   : unlocking_script.GetData().GetBytes();
  int ret = wally_tx_add_elements_raw_input(
      tx_pointer, txid_buf.data(), txid_buf.size(), index, sequence,
      script_data.data(), script_data.size(), NULL, NULL, 0, NULL, 0, NULL, 0,
      NULL, 0, NULL, 0, NULL, 0, NULL, 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_add_elements_raw_input NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "txin add error.");
  }

  size_t is_coinbase = 0;
  wally_tx_is_coinbase(tx_pointer, &is_coinbase);
  uint32_t set_index = (is_coinbase == 0) ? index & kTxInVoutMask : index;
  ConfidentialTxIn txin(txid, set_index, sequence);
  if (!unlocking_script.IsEmpty()) {
    txin = ConfidentialTxIn(txid, set_index, sequence, unlocking_script);
  }
  vin_.push_back(txin);
  return static_cast<uint32_t>(vin_.size() - 1);
}